

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimal_column_writer.cpp
# Opt level: O0

void duckdb::WriteParquetDecimal(hugeint_t input,data_ptr_t result)

{
  byte *in_RDX;
  int64_t in_RSI;
  uint64_t in_RDI;
  undefined1 auVar1 [16];
  unsigned_long shift_count_1;
  idx_t i_1;
  unsigned_long shift_count;
  idx_t i;
  uint64_t low_bytes;
  uint64_t high_bytes;
  bool positive;
  ulong local_98;
  ulong local_88;
  hugeint_t local_70;
  hugeint_t local_60;
  hugeint_t local_50 [2];
  hugeint_t local_30;
  byte local_19;
  byte *local_18;
  hugeint_t local_10;
  
  local_18 = in_RDX;
  local_10.lower = in_RDI;
  local_10.upper = in_RSI;
  duckdb::hugeint_t::hugeint_t(&local_30,0);
  local_19 = duckdb::hugeint_t::operator>=(&local_10,&local_30);
  auVar1._8_8_ = local_10.upper;
  auVar1._0_8_ = local_10.lower;
  local_19 = local_19 & 1;
  if (local_19 == 0) {
    local_60 = NumericLimits<duckdb::hugeint_t>::Maximum();
    local_50[0] = (hugeint_t)duckdb::hugeint_t::operator+(&local_60,&local_10);
    duckdb::hugeint_t::hugeint_t(&local_70,1);
    auVar1 = duckdb::hugeint_t::operator+(local_50,&local_70);
  }
  local_10.upper = auVar1._8_8_;
  local_10.lower = auVar1._0_8_;
  for (local_88 = 0; local_88 < 8; local_88 = local_88 + 1) {
    local_18[local_88] = (byte)((ulong)local_10.upper >> (('\a' - (char)local_88) * '\b' & 0x3fU));
  }
  for (local_98 = 0; local_98 < 8; local_98 = local_98 + 1) {
    local_18[local_98 + 8] = (byte)(local_10.lower >> (('\a' - (char)local_98) * '\b' & 0x3fU));
  }
  if ((local_19 & 1) == 0) {
    *local_18 = *local_18 | 0x80;
  }
  return;
}

Assistant:

static void WriteParquetDecimal(hugeint_t input, data_ptr_t result) {
	bool positive = input >= 0;
	// numbers are stored as two's complement so some muckery is required
	if (!positive) {
		input = NumericLimits<hugeint_t>::Maximum() + input + 1;
	}
	uint64_t high_bytes = uint64_t(input.upper);
	uint64_t low_bytes = input.lower;

	for (idx_t i = 0; i < sizeof(uint64_t); i++) {
		auto shift_count = (sizeof(uint64_t) - i - 1) * 8;
		result[i] = (high_bytes >> shift_count) & 0xFF;
	}
	for (idx_t i = 0; i < sizeof(uint64_t); i++) {
		auto shift_count = (sizeof(uint64_t) - i - 1) * 8;
		result[sizeof(uint64_t) + i] = (low_bytes >> shift_count) & 0xFF;
	}
	if (!positive) {
		result[0] |= 0x80;
	}
}